

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O3

void http_dial_cb(void *arg)

{
  nni_mtx *mtx;
  nni_aio *aio;
  nng_err nVar1;
  nng_http *in_RAX;
  nni_aio *aio_00;
  nng_stream *pnVar2;
  nng_http *local_38;
  nni_http_conn *conn;
  
  mtx = (nni_mtx *)((long)arg + 0x18);
  local_38 = in_RAX;
  nni_mtx_lock(mtx);
  aio = (nni_aio *)((long)arg + 0x48);
  nVar1 = nni_aio_result(aio);
  aio_00 = (nni_aio *)nni_list_first((nni_list *)arg);
  if (aio_00 == (nni_aio *)0x0) {
    nni_mtx_unlock(mtx);
    if (nVar1 == NNG_OK) {
      pnVar2 = (nng_stream *)nni_aio_get_output(aio,0);
      nng_stream_free(pnVar2);
      return;
    }
  }
  else {
    nni_aio_list_remove(aio_00);
    if (nVar1 != NNG_OK) {
      http_dial_start((nni_http_client *)arg);
      nni_mtx_unlock(mtx);
      nni_aio_finish_error(aio_00,nVar1);
      return;
    }
    pnVar2 = (nng_stream *)nni_aio_get_output(aio,0);
    if (pnVar2 == (nng_stream *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_client.c"
                ,0x4a,"stream != NULL");
    }
    nVar1 = nni_http_init(&local_38,pnVar2,true);
    http_dial_start((nni_http_client *)arg);
    nni_mtx_unlock(mtx);
    if (nVar1 == NNG_OK) {
      nni_http_set_host(local_38,(char *)((long)arg + 0x210));
      nni_aio_set_output(aio_00,0,local_38);
      nni_aio_finish(aio_00,NNG_OK,0);
    }
    else {
      nni_aio_finish_error(aio_00,nVar1);
    }
  }
  return;
}

Assistant:

static void
http_dial_cb(void *arg)
{
	nni_http_client *c = arg;
	nni_aio         *aio;
	nng_err          rv;
	nng_stream      *stream;
	nni_http_conn   *conn;

	nni_mtx_lock(&c->mtx);
	rv = nni_aio_result(&c->aio);

	if ((aio = nni_list_first(&c->aios)) == NULL) {
		// User abandoned request, and no residuals left.
		nni_mtx_unlock(&c->mtx);
		if (rv == 0) {
			stream = nni_aio_get_output(&c->aio, 0);
			nng_stream_free(stream);
		}
		return;
	}

	if (rv != NNG_OK) {
		nni_aio_list_remove(aio);
		http_dial_start(c);
		nni_mtx_unlock(&c->mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nni_aio_list_remove(aio);
	stream = nni_aio_get_output(&c->aio, 0);
	NNI_ASSERT(stream != NULL);

	rv = nni_http_init(&conn, stream, true);

	// set up the host header
	http_dial_start(c);
	nni_mtx_unlock(&c->mtx);

	if (rv != NNG_OK) {
		// the conn_init function will have already discard stream.
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_http_set_host(conn, c->host);
	nni_aio_set_output(aio, 0, conn);
	nni_aio_finish(aio, NNG_OK, 0);
}